

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O1

void Cgt_ManCollectVisited_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar1 & 7) == 2) {
    return;
  }
  if (pObj->TravId == pAig->nTravIds) {
    return;
  }
  pObj->TravId = pAig->nTravIds;
  if ((uVar1 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                  ,0x9e,"void Cgt_ManCollectVisited_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  Cgt_ManCollectVisited_rec(pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vVisited);
  Cgt_ManCollectVisited_rec(pAig,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vVisited);
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_0049e50e;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar2;
    }
    vVisited->nCap = iVar3;
  }
LAB_0049e50e:
  iVar3 = vVisited->nSize;
  vVisited->nSize = iVar3 + 1;
  vVisited->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Cgt_ManCollectVisited_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( Aig_ObjIsCi(pObj) )
        return;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    assert( Aig_ObjIsNode(pObj) );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin0(pObj), vVisited );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
}